

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O3

GPU_Renderer * GPU_GetRenderer(GPU_RendererID id)

{
  GPU_Renderer *pGVar1;
  long lVar2;
  
  gpu_init_renderer_register();
  if ((GPU_RendererEnum)id.name != 0) {
    lVar2 = 0;
    do {
      pGVar1 = *(GPU_Renderer **)((long)_gpu_renderer_map + lVar2);
      if ((pGVar1 != (GPU_Renderer *)0x0) && ((GPU_RendererEnum)id.name == (pGVar1->id).renderer)) {
        return pGVar1;
      }
      lVar2 = lVar2 + 8;
    } while (lVar2 != 0xa0);
  }
  return (GPU_Renderer *)0x0;
}

Assistant:

GPU_Renderer* GPU_GetRenderer(GPU_RendererID id)
{
	int i;
	gpu_init_renderer_register();
	
	// Invalid enum?
	if(id.renderer == GPU_RENDERER_UNKNOWN)
        return NULL;
	
	for(i = 0; i < GPU_MAX_ACTIVE_RENDERERS; i++)
	{
		if(_gpu_renderer_map[i] == NULL)
			continue;
		
		if(id.renderer == _gpu_renderer_map[i]->id.renderer)
			return _gpu_renderer_map[i];
	}
    
    return NULL;
}